

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

string * __thiscall
tlx::CmdlineParser::Argument::option_text_abi_cxx11_(string *__return_storage_ptr__,Argument *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->key_ != '\0') {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  if ((this->keytype_)._M_string_length != 0) {
    std::operator+(&local_30,' ',&this->keytype_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string option_text() const {
        std::string s;
        if (key_ != 0) {
            s += '-', s += key_, s += ", ";
        }
        s += "--", s += longkey_;
        if (!keytype_.empty()) {
            s += ' ' + keytype_;
        }
        return s;
    }